

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcp-quicksort.cpp
# Opt level: O1

void lcpsort<false>(uchar **strings,Lcp *lcps,int lo,int hi)

{
  int iVar1;
  int iVar2;
  Lcp LVar3;
  uchar *puVar4;
  int iVar5;
  int hi_00;
  int lo_00;
  
  while (lo < hi) {
    iVar1 = lcps[lo];
    iVar5 = lo + 1;
    hi_00 = hi;
    lo_00 = lo;
    do {
      iVar2 = lcps[iVar5];
      if (iVar2 < iVar1) {
        puVar4 = strings[iVar5];
        strings[iVar5] = strings[hi_00];
        strings[hi_00] = puVar4;
        lcps[iVar5] = lcps[hi_00];
        lcps[hi_00] = iVar2;
        hi_00 = hi_00 + -1;
      }
      else if (iVar1 < iVar2) {
        puVar4 = strings[lo_00];
        strings[lo_00] = strings[iVar5];
        strings[iVar5] = puVar4;
        LVar3 = lcps[lo_00];
        lcps[lo_00] = iVar2;
        lcps[iVar5] = LVar3;
        iVar5 = iVar5 + 1;
        lo_00 = lo_00 + 1;
      }
      else {
        iVar5 = iVar5 + 1;
      }
    } while (iVar5 <= hi_00);
    strsort(strings,lcps,lo_00,hi_00);
    lcpsort<false>(strings,lcps,lo,lo_00 + -1);
    lo = hi_00 + 1;
  }
  return;
}

Assistant:

void lcpsort( unsigned char * strings[], Lcp lcps[], int lo, int hi ) {
  if ( hi <= lo ) return;
  int lt = lo, gt = hi;

  Lcp pivot = lcps[lo];
  for( int i = lo + 1; i <= gt; ) {
    if      ( ascending ? lcps[i] > pivot : lcps[i] < pivot ) exch( strings, lcps, i, gt--);
    else if ( ascending ? lcps[i] < pivot : lcps[i] > pivot ) exch( strings, lcps, lt++, i++);
    else            i++;
  }

  strsort( strings, lcps, lt, gt );
  lcpsort<ascending>( strings, lcps, lo, lt-1 );
  lcpsort<ascending>( strings, lcps, gt+1, hi );
}